

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printSequentialContainer<QSet<QGesture*>>
          (QtPrivate *this,QDebug debug,char *which,QSet<QGesture_*> *c)

{
  char *pcVar1;
  QTextStream *pQVar2;
  undefined8 uVar3;
  ulong uVar4;
  storage_type *psVar5;
  storage_type *psVar6;
  ulong uVar7;
  Data *pDVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebugStateSaver saver;
  QGesture local_78;
  QGesture local_68;
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar2 = *(QTextStream **)debug.stream;
  pQVar2[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar6 = (storage_type *)0x0;
  }
  else {
    psVar5 = (storage_type *)0xffffffffffffffff;
    do {
      psVar6 = psVar5 + 1;
      pcVar1 = which + 1 + (long)psVar5;
      psVar5 = psVar6;
    } while (*pcVar1 != '\0');
  }
  QVar9.m_data = psVar6;
  QVar9.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar2,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pDVar8 = (c->q_hash).d;
  if (pDVar8 == (Data *)0x0) {
    pDVar8 = (Data *)0x0;
  }
  else if (pDVar8->spans->offsets[0] == 0xff) {
    uVar4 = 1;
    do {
      uVar7 = uVar4;
      if (pDVar8->numBuckets == uVar7) {
        pDVar8 = (Data *)0x0;
        uVar7 = 0;
        break;
      }
      uVar4 = uVar7 + 1;
    } while (pDVar8->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
    goto LAB_002e15e1;
  }
  uVar7 = 0;
LAB_002e15e1:
  if (pDVar8 != (Data *)0x0 || uVar7 != 0) {
    local_68._0_8_ = *(undefined8 *)debug.stream;
    *(int *)(local_68._0_8_ + 0x28) = *(int *)(local_68._0_8_ + 0x28) + 1;
    ::operator<<((QDebug)&local_68.field_0x8,&local_68);
    QDebug::~QDebug((QDebug *)&local_68.field_0x8);
    QDebug::~QDebug((QDebug *)&local_68);
    do {
      if (pDVar8->numBuckets - 1 == uVar7) {
        pDVar8 = (Data *)0x0;
        uVar7 = 0;
        break;
      }
      uVar7 = uVar7 + 1;
    } while (pDVar8->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
  }
  if ((pDVar8 != (Data *)0x0) || (uVar7 != 0)) {
    do {
      pQVar2 = *(QTextStream **)debug.stream;
      QVar10.m_data = (storage_type *)0x2;
      QVar10.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<(pQVar2,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      local_78._0_8_ = *(undefined8 *)debug.stream;
      *(int *)(local_78._0_8_ + 0x28) = *(int *)(local_78._0_8_ + 0x28) + 1;
      ::operator<<((QDebug)&local_78.field_0x8,&local_78);
      QDebug::~QDebug((QDebug *)&local_78.field_0x8);
      QDebug::~QDebug((QDebug *)&local_78);
      do {
        if (pDVar8->numBuckets - 1 == uVar7) {
          pDVar8 = (Data *)0x0;
          uVar7 = 0;
          break;
        }
        uVar7 = uVar7 + 1;
      } while (pDVar8->spans[uVar7 >> 7].offsets[(uint)uVar7 & 0x7f] == 0xff);
    } while ((pDVar8 != (Data *)0x0) || (uVar7 != 0));
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  uVar3 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar3;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}